

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMP2.h
# Opt level: O0

void __thiscall XPMP2::GlobVars::GlobVars(GlobVars *this,logLevelTy _logLvl,bool _logMdlMatch)

{
  byte in_DL;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  allocator<char> *in_stack_ffffffffffffff20;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff28;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined4 *local_98;
  string *local_60;
  allocator<char> local_20;
  allocator<char> local_1f;
  allocator<char> local_1e;
  allocator<char> local_1d [15];
  allocator<char> local_e;
  byte local_d;
  
  local_d = in_DL & 1;
  *in_RDI = in_ESI;
  *(byte *)(in_RDI + 1) = local_d;
  *(undefined1 *)((long)in_RDI + 5) = 0;
  *(undefined1 *)((long)in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 7) = 0;
  *(undefined1 *)(in_RDI + 2) = 1;
  std::__cxx11::string::string((string *)(in_RDI + 4));
  std::__cxx11::list<XPMP2::Obj8DataRefs,_std::allocator<XPMP2::Obj8DataRefs>_>::list
            ((list<XPMP2::Obj8DataRefs,_std::allocator<XPMP2::Obj8DataRefs>_> *)0x374700);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::allocator<char>::~allocator(&local_e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::allocator<char>::~allocator(local_1d);
  *(code **)(in_RDI + 0x22) = PrefsFuncIntDefault;
  std::__cxx11::list<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_>::list
            ((list<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_> *)
             0x3747d2);
  std::__cxx11::string::string((string *)(in_RDI + 0x2a));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::Doc8643,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::Doc8643>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::Doc8643,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::Doc8643>_>_>
         *)0x37480a);
  local_60 = (string *)(in_RDI + 0x3e);
  do {
    std::__cxx11::string::string(local_60);
    local_60 = local_60 + 0x20;
  } while (local_60 != (string *)(in_RDI + 0x4e));
  local_98 = in_RDI + 0x4e;
  do {
    memset(local_98,0,0x30);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *)0x3748b7);
    local_98 = local_98 + 0xc;
  } while (local_98 != in_RDI + 0x66);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x66);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x3748eb);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>_>
         *)0x374904);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::allocator<char>::~allocator(&local_1e);
  __a = (allocator<char> *)(in_RDI + 0x86);
  __s = &local_1f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::~allocator(&local_1f);
  std::__cxx11::string::string((string *)(in_RDI + 0x8e));
  std::
  map<unsigned_int,_XPMP2::Aircraft_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::Aircraft_*>_>_>
  ::map((map<unsigned_int,_XPMP2::Aircraft_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::Aircraft_*>_>_>
         *)0x3749ca);
  *(undefined1 *)(in_RDI + 0xa2) = 1;
  in_RDI[0xa3] = 0;
  in_RDI[0xa4] = 0x45ada000;
  *(undefined1 *)(in_RDI + 0xa5) = 1;
  in_RDI[0xa6] = 0x3f800000;
  *(undefined1 *)(in_RDI + 0xa7) = 0;
  in_RDI[0xa8] = 0;
  *(undefined1 *)(in_RDI + 0xa9) = 1;
  *(undefined1 *)((long)in_RDI + 0x2a5) = 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
         *)0x374a2e);
  std::__cxx11::string::string((string *)(in_RDI + 0xb6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::~allocator(&local_20);
  in_RDI[0xc6] = 0xc27c;
  std::__cxx11::string::string((string *)(in_RDI + 200));
  in_RDI[0xd0] = 8;
  *(undefined8 *)(in_RDI + 0xd2) = 0x2000;
  in_RDI[0xd4] = 5;
  in_RDI[0xd5] = 0;
  in_RDI[0xd6] = 0;
  in_RDI[0xd7] = 0;
  in_RDI[0xd8] = 25000;
  in_RDI[0xd9] = 45000;
  in_RDI[0xda] = 0x19;
  *(undefined1 *)(in_RDI + 0xdb) = 0;
  *(undefined1 *)((long)in_RDI + 0x36d) = 1;
  *(undefined1 *)((long)in_RDI + 0x36e) = 0;
  *(undefined1 *)((long)in_RDI + 0x36f) = 1;
  *(undefined1 *)(in_RDI + 0xdc) = 0;
  in_RDI[0xdd] = 0x3f800000;
  *(undefined1 *)(in_RDI + 0xde) = 0;
  in_RDI[0xdf] = 0xffffffff;
  in_RDI[0xe0] = 0xffffffff;
  *(undefined1 *)(in_RDI + 0xe1) = 0;
  *(undefined1 *)((long)in_RDI + 0x385) = 0;
  in_RDI[0xe2] = 0;
  std::thread::id::id((id *)(in_RDI + 0xe4));
  in_RDI[0xe6] = 0;
  in_RDI[0xe7] = 0;
  in_RDI[0xe8] = 0;
  in_RDI[0xe9] = 0;
  in_RDI[0xea] = 0;
  in_RDI[0xeb] = 0;
  in_RDI[0xec] = 0;
  in_RDI[0xed] = 0;
  in_RDI[0xee] = 0;
  in_RDI[0xef] = 0;
  in_RDI[0xf0] = 0;
  in_RDI[0xf1] = 0;
  in_RDI[0xf2] = 0;
  in_RDI[0xf3] = 0;
  in_RDI[0xf4] = 0;
  in_RDI[0xf5] = 0;
  in_RDI[0xf6] = 0;
  in_RDI[0xf7] = 0;
  in_RDI[0xf8] = 0;
  in_RDI[0xf9] = 0;
  return;
}

Assistant:

GlobVars (logLevelTy _logLvl = logINFO, bool _logMdlMatch = false) :
    logLvl(_logLvl), bLogMdlMatch(_logMdlMatch) {}